

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O2

void gravity_function_serialize(gravity_function_t *f,json_t *json)

{
  uint uVar1;
  uint uVar2;
  char *key;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint32_t i;
  ulong uVar8;
  ulong uVar9;
  char temp [256];
  
  pcVar3 = f->identifier;
  if (f->tag == EXEC_TYPE_SPECIAL) {
    gravity_function_special_serialize(f,pcVar3,json);
    return;
  }
  if (pcVar3 == (char *)0x0) {
    pcVar3 = temp;
    snprintf(pcVar3,0x100,"$anon_%p",f);
  }
  key = json_get_label(json,pcVar3);
  json_begin_object(json,key);
  json_add_cstring(json,"type","function");
  json_add_cstring(json,"identifier",pcVar3);
  json_add_int(json,"tag",(ulong)f->tag);
  json_add_int(json,"nparam",(ulong)f->nparams);
  json_add_bool(json,"args",(f->field_9).field_0.useargs);
  if (f->tag != EXEC_TYPE_NATIVE) goto LAB_001352ac;
  json_add_int(json,"nlocal",(ulong)f->nlocals);
  json_add_int(json,"ntemp",(ulong)f->ntemps);
  json_add_int(json,"nup",(ulong)f->nupvalues);
  json_add_double(json,"purity",(double)(f->field_9).field_0.purity);
  if ((f->field_9).field_0.bytecode == (uint32_t *)0x0) {
LAB_00135127:
    json_add_null(json,"bytecode");
  }
  else {
    uVar1 = (f->field_9).field_0.ninsts;
    if ((ulong)uVar1 == 0) goto LAB_00135127;
    pcVar3 = (char *)gravity_calloc((gravity_vm *)0x0,1,(ulong)(uVar1 * 8));
    uVar5 = 0;
    for (uVar8 = 0; uVar8 != uVar1; uVar8 = uVar8 + 1) {
      uVar2 = (f->field_9).field_0.bytecode[uVar8];
      uVar6 = uVar5 + 8;
      for (iVar4 = 0x1c; iVar4 != -4; iVar4 = iVar4 + -4) {
        uVar9 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
        pcVar3[uVar9] = "0123456789ABCDEF"[uVar2 >> ((byte)iVar4 & 0x1f) & 0xf];
      }
      uVar5 = uVar6;
    }
    json_add_string(json,"bytecode",pcVar3,(ulong)(uVar1 * 8));
    free(pcVar3);
    if ((f->field_9).field_0.lineno != (uint32_t *)0x0) {
      uVar1 = (f->field_9).field_0.ninsts;
      uVar8 = (ulong)(uVar1 * 8);
      pcVar3 = (char *)gravity_calloc((gravity_vm *)0x0,1,uVar8);
      uVar5 = 0;
      for (uVar9 = 0; uVar9 != uVar1; uVar9 = uVar9 + 1) {
        uVar2 = (f->field_9).field_0.lineno[uVar9];
        uVar6 = uVar5 + 8;
        for (iVar4 = 0x1c; iVar4 != -4; iVar4 = iVar4 + -4) {
          uVar7 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
          pcVar3[uVar7] = "0123456789ABCDEF"[uVar2 >> ((byte)iVar4 & 0x1f) & 0xf];
        }
        uVar5 = uVar6;
      }
      json_add_string(json,"lineno",pcVar3,uVar8);
      free(pcVar3);
    }
  }
  json_begin_array(json,"pool");
  gravity_function_array_serialize(f,json,(f->field_9).field_0.cpool);
  json_end_array(json);
  if ((f->field_9).field_0.pvalue.n != 0) {
    json_begin_array(json,"pvalues");
    gravity_function_array_serialize(f,json,(f->field_9).field_0.pvalue);
    json_end_array(json);
  }
  if ((f->field_9).field_0.pname.n != 0) {
    json_begin_array(json,"pnames");
    gravity_function_array_serialize(f,json,(f->field_9).field_0.pname);
    json_end_array(json);
  }
LAB_001352ac:
  json_end_object(json);
  return;
}

Assistant:

void gravity_function_serialize (gravity_function_t *f, json_t *json) {
    // special functions need a special serialization
    if (f->tag == EXEC_TYPE_SPECIAL) {
        gravity_function_special_serialize(f, f->identifier, json);
        return;
    }

    // compute identifier (cannot be NULL)
    const char *identifier = f->identifier;
    char temp[256];
    if (!identifier) {snprintf(temp, sizeof(temp), "$anon_%p", f); identifier = temp;}

    const char *label = json_get_label(json, identifier);
    json_begin_object(json, label);
    
    json_add_cstring(json, GRAVITY_JSON_LABELTYPE, GRAVITY_JSON_FUNCTION);  // MANDATORY 1st FIELD
    json_add_cstring(json, GRAVITY_JSON_LABELIDENTIFIER, identifier);       // MANDATORY 2nd FIELD (not for getter/setter)
    json_add_int(json, GRAVITY_JSON_LABELTAG, f->tag);

    // common fields
    json_add_int(json, GRAVITY_JSON_LABELNPARAM, f->nparams);
    json_add_bool(json, GRAVITY_JSON_LABELARGS, f->useargs);

    if (f->tag == EXEC_TYPE_NATIVE) {
        // native only fields
        json_add_int(json, GRAVITY_JSON_LABELNLOCAL, f->nlocals);
        json_add_int(json, GRAVITY_JSON_LABELNTEMP, f->ntemps);
        json_add_int(json, GRAVITY_JSON_LABELNUPV, f->nupvalues);
        json_add_double(json, GRAVITY_JSON_LABELPURITY, f->purity);

        // bytecode
        gravity_function_bytecode_serialize(f, json);

        // constant pool
        json_begin_array(json, GRAVITY_JSON_LABELPOOL);
        gravity_function_array_serialize(f, json, f->cpool);
        json_end_array(json);
        
        // default values (if any)
        if (marray_size(f->pvalue)) {
            json_begin_array(json, GRAVITY_JSON_LABELPVALUES);
            gravity_function_array_serialize(f, json, f->pvalue);
        json_end_array(json);
    }

        // arg names (if any)
        if (marray_size(f->pname)) {
            json_begin_array(json, GRAVITY_JSON_LABELPNAMES);
            gravity_function_array_serialize(f, json, f->pname);
            json_end_array(json);
        }
    }
    
    json_end_object(json);
}